

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::XFormWidget::drawHandles(XFormWidget *this)

{
  double *pdVar1;
  Mode MVar2;
  pointer pVVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dStack_188;
  double dStack_178;
  double dStack_170;
  double dStack_168;
  double dStack_160;
  undefined1 auStack_158 [16];
  double dStack_148;
  double dStack_140;
  undefined1 auStack_138 [16];
  double dStack_128;
  double dStack_120;
  double dStack_118;
  undefined8 uStack_110;
  double dStack_108;
  double dStack_100;
  double dStack_f8;
  double dStack_f0;
  undefined1 auStack_e8 [16];
  undefined1 auStack_d8 [16];
  undefined8 uStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  undefined1 auStack_a8 [12];
  undefined4 uStack_9c;
  double dStack_98;
  double dStack_90;
  undefined1 auStack_88 [16];
  undefined1 auStack_78 [16];
  double dStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  
  MVar2 = this->mode;
  if (MVar2 == Scale) {
    if ((this->target).object != (SceneObject *)0x0) {
      dStack_128 = (this->center).x;
      dStack_120 = (this->center).y;
      dStack_118 = (this->center).z;
      dVar15 = (this->bounds).max.x - (this->bounds).min.x;
      dVar14 = (this->bounds).max.y - (this->bounds).min.y;
      dVar17 = (this->bounds).max.z - (this->bounds).min.z;
      dVar15 = SQRT(dVar17 * dVar17 + dVar15 * dVar15 + dVar14 * dVar14) * 0.5;
      glLineWidth(0x41000000);
      glBegin(1);
      dVar14 = dVar15 * 0.9;
      auStack_158._8_4_ = SUB84(dVar14,0);
      auStack_158._0_8_ = dVar14;
      auStack_158._12_4_ = (int)((ulong)dVar14 >> 0x20);
      for (lVar10 = 0; lVar10 != 0x48; lVar10 = lVar10 + 0x18) {
        pVVar3 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_168 = *(double *)((long)&pVVar3->z + lVar10) * dVar14 + dStack_118;
        pdVar1 = (double *)((long)&pVVar3->x + lVar10);
        dStack_178 = *pdVar1 * (double)auStack_158._0_8_ + dStack_128;
        dStack_170 = pdVar1[1] * (double)auStack_158._8_8_ + dStack_120;
        glColor4ubv(*(undefined8 *)
                     ((long)&(((this->axisColors).
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar10));
        glVertex3dv(&dStack_128);
        glVertex3dv(&dStack_178);
      }
      glEnd();
      glBegin(7);
      auStack_78._0_8_ = dVar15 * 0.8;
      dVar15 = dVar15 * 0.5 * 0.2;
      auStack_158._8_8_ = 0;
      auStack_158._0_8_ = auStack_78._0_8_;
      auStack_88._8_4_ = SUB84(dVar15,0);
      auStack_88._0_8_ = dVar15;
      auStack_88._12_4_ = (int)((ulong)dVar15 >> 0x20);
      auStack_78._8_8_ = auStack_78._0_8_;
      for (lVar10 = 0; lVar10 != 0x48; lVar10 = lVar10 + 0x18) {
        glColor4ubv(*(undefined8 *)
                     ((long)&(((this->axisColors).
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar10));
        pVVar3 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_f8 = *(double *)((long)&pVVar3->z + lVar10) * (double)auStack_158._0_8_ + dStack_118;
        pdVar1 = (double *)((long)&pVVar3->x + lVar10);
        dStack_108 = *pdVar1 * (double)auStack_78._0_8_ + dStack_128;
        dStack_100 = pdVar1[1] * (double)auStack_78._8_8_ + dStack_120;
        dVar16 = pVVar3[1].x;
        dVar4 = pVVar3[1].y;
        dVar14 = pVVar3[1].z;
        dVar5 = pVVar3[2].x;
        dVar6 = pVVar3[2].y;
        dVar17 = pVVar3[2].z;
        dStack_178 = ((pVVar3->x - dVar16) - dVar5) * (double)auStack_88._0_8_ + dStack_108;
        dStack_170 = ((pVVar3->y - dVar4) - dVar6) * (double)auStack_88._8_8_ + dStack_100;
        dStack_168 = ((pVVar3->z - dVar14) - dVar17) * dVar15 + dStack_f8;
        dStack_98 = ((pVVar3->z - dVar14) + dVar17) * dVar15 + dStack_f8;
        stack0xffffffffffffff60 =
             ((pVVar3->y - dVar4) + dVar6) * (double)auStack_88._8_8_ + dStack_100;
        auStack_a8._0_8_ = ((pVVar3->x - dVar16) + dVar5) * (double)auStack_88._0_8_ + dStack_108;
        dStack_b8 = ((pVVar3->z + dVar14) - dVar17) * dVar15 + dStack_f8;
        uStack_c8 = ((pVVar3->x + dVar16) - dVar5) * (double)auStack_88._0_8_ + dStack_108;
        dStack_c0 = ((pVVar3->y + dVar4) - dVar6) * (double)auStack_88._8_8_ + dStack_100;
        dStack_148 = (pVVar3->x + dVar16 + dVar5) * (double)auStack_88._0_8_ + dStack_108;
        dStack_140 = (pVVar3->y + dVar4 + dVar6) * (double)auStack_88._8_8_ + dStack_100;
        auStack_138._0_8_ = (pVVar3->z + dVar14 + dVar17) * dVar15 + dStack_f8;
        dStack_38 = ((-pVVar3->z - dVar14) - dVar17) * dVar15 + dStack_f8;
        dStack_48 = ((-pVVar3->x - dVar16) - dVar5) * (double)auStack_88._0_8_ + dStack_108;
        dStack_40 = ((-pVVar3->y - dVar4) - dVar6) * (double)auStack_88._8_8_ + dStack_100;
        dStack_58 = ((-pVVar3->z - dVar14) + dVar17) * dVar15 + dStack_f8;
        dStack_68 = ((-pVVar3->x - dVar16) + dVar5) * (double)auStack_88._0_8_ + dStack_108;
        dStack_60 = ((-pVVar3->y - dVar4) + dVar6) * (double)auStack_88._8_8_ + dStack_100;
        auStack_e8._8_8_ = ((dVar4 - pVVar3->y) - dVar6) * (double)auStack_88._8_8_ + dStack_100;
        auStack_e8._0_8_ = ((dVar16 - pVVar3->x) - dVar5) * (double)auStack_88._0_8_ + dStack_108;
        auStack_d8._0_8_ = ((dVar14 - pVVar3->z) - dVar17) * dVar15 + dStack_f8;
        dStack_f8 = ((dVar14 - pVVar3->z) + dVar17) * dVar15 + dStack_f8;
        dStack_108 = ((dVar16 - pVVar3->x) + dVar5) * (double)auStack_88._0_8_ + dStack_108;
        dStack_100 = ((dVar4 - pVVar3->y) + dVar6) * (double)auStack_88._8_8_ + dStack_100;
        glVertex3dv(&dStack_178);
        glVertex3dv(auStack_a8);
        glVertex3dv(&dStack_148);
        glVertex3dv(&uStack_c8);
        glVertex3dv(&dStack_48);
        glVertex3dv(&dStack_68);
        glVertex3dv(&dStack_108);
        glVertex3dv(auStack_e8);
        glVertex3dv(&dStack_178);
        glVertex3dv(&uStack_c8);
        glVertex3dv(auStack_e8);
        glVertex3dv(&dStack_48);
        glVertex3dv(auStack_a8);
        glVertex3dv(&dStack_148);
        glVertex3dv(&dStack_108);
        glVertex3dv(&dStack_68);
        glVertex3dv(&dStack_178);
        glVertex3dv(&dStack_48);
        glVertex3dv(&dStack_68);
        glVertex3dv(auStack_a8);
        glVertex3dv(&uStack_c8);
        glVertex3dv(auStack_e8);
        glVertex3dv(&dStack_108);
        glVertex3dv(&dStack_148);
      }
      glEnd();
      drawCenterHandle(this);
      glLineWidth(0x3f800000);
    }
    return;
  }
  if (MVar2 == Rotate) {
    if ((this->target).object != (SceneObject *)0x0) {
      dStack_98 = (this->center).x;
      dStack_90 = (this->center).y;
      dVar15 = (this->bounds).max.x - (this->bounds).min.x;
      dVar14 = (this->bounds).max.y - (this->bounds).min.y;
      dStack_100 = (this->center).z;
      dVar17 = (this->bounds).max.z - (this->bounds).min.z;
      uStack_c8 = SQRT(dVar17 * dVar17 + dVar15 * dVar15 + dVar14 * dVar14) * 0.5;
      dStack_c0 = 0.0;
      uStack_110 = 0x17fc7f;
      glLineWidth(0x41000000);
      uStack_110 = 0x17fc87;
      glBegin(1);
      auStack_a8._8_4_ = (undefined4)uStack_c8;
      auStack_a8._0_8_ = uStack_c8;
      uStack_9c = uStack_c8._4_4_;
      uVar7 = 0;
      while (uVar7 != 3) {
        uVar13 = uVar7 + 1;
        uVar8 = 0;
        if (uVar13 != 3) {
          uVar8 = uVar13 & 0xffffffff;
        }
        pVVar3 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        auStack_e8._0_8_ = pVVar3[uVar8].z;
        uVar12 = (ulong)((int)uVar7 - 1);
        if (uVar7 == 0) {
          uVar12 = 2;
        }
        auStack_78._0_8_ = pVVar3[uVar8].x;
        auStack_78._8_8_ = pVVar3[uVar8].y;
        auStack_88._0_8_ = pVVar3[uVar12].x;
        auStack_88._8_8_ = pVVar3[uVar12].y;
        dStack_f0 = pVVar3[uVar12].z;
        uStack_110 = 0x17fd28;
        glColor4ubv((this->axisColors).
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar7].
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
        dStack_f8 = 0.0;
        for (iVar11 = 1; uVar7 = uVar13, iVar11 != 0x41; iVar11 = iVar11 + 1) {
          dStack_b0 = dStack_f8 * 6.283185307179586 * 0.015625;
          dStack_f8 = dStack_f8 + 1.0;
          auStack_e8._8_8_ = (double)iVar11 * 6.283185307179586 * 0.015625;
          uStack_110 = 0x17fd8f;
          dStack_108 = cos(dStack_b0);
          auStack_d8._8_4_ = extraout_XMM0_Dc;
          auStack_d8._0_8_ = dStack_108;
          auStack_d8._12_4_ = extraout_XMM0_Dd;
          dStack_108 = (double)auStack_e8._0_8_ * dStack_108;
          uStack_110 = 0x17fdaf;
          dVar15 = sin(dStack_b0);
          dStack_38 = (dStack_108 - dStack_f0 * dVar15) * uStack_c8 + dStack_100;
          dStack_48 = ((double)auStack_d8._0_8_ * (double)auStack_78._0_8_ -
                      dVar15 * (double)auStack_88._0_8_) * (double)auStack_a8._0_8_ + dStack_98;
          dStack_40 = ((double)auStack_d8._0_8_ * (double)auStack_78._8_8_ -
                      dVar15 * (double)auStack_88._8_8_) * stack0xffffffffffffff60 + dStack_90;
          uStack_110 = 0x17fe1b;
          dStack_108 = cos((double)auStack_e8._8_8_);
          auStack_d8._8_4_ = extraout_XMM0_Dc_00;
          auStack_d8._0_8_ = dStack_108;
          auStack_d8._12_4_ = extraout_XMM0_Dd_00;
          dStack_108 = (double)auStack_e8._0_8_ * dStack_108;
          uStack_110 = 0x17fe3b;
          dVar15 = sin((double)auStack_e8._8_8_);
          dStack_58 = (dStack_108 - dStack_f0 * dVar15) * uStack_c8 + dStack_100;
          dStack_68 = ((double)auStack_d8._0_8_ * (double)auStack_78._0_8_ -
                      dVar15 * (double)auStack_88._0_8_) * (double)auStack_a8._0_8_ + dStack_98;
          dStack_60 = ((double)auStack_d8._0_8_ * (double)auStack_78._8_8_ -
                      dVar15 * (double)auStack_88._8_8_) * stack0xffffffffffffff60 + dStack_90;
          uStack_110 = 0x17fea4;
          glVertex3dv(&dStack_48);
          uStack_110 = 0x17feac;
          glVertex3dv(&dStack_68);
        }
      }
      uStack_110 = 0x17fec0;
      glEnd();
      uStack_110 = 0x17fec8;
      drawCenterHandle(this);
      uStack_110 = 0x17fed5;
      glLineWidth(0x3f800000);
    }
    return;
  }
  if (MVar2 == Translate) {
    if ((this->target).object != (SceneObject *)0x0) {
      uVar9 = 0;
      if (this->transformedMode != false) {
        uVar9 = ((byte)~this->objectMode & 1) * 2;
      }
      dStack_108 = (this->center).x;
      dStack_100 = (this->center).y;
      dStack_f8 = (this->center).z;
      dVar15 = (this->bounds).max.x - (this->bounds).min.x;
      dVar14 = (this->bounds).max.y - (this->bounds).min.y;
      dVar17 = (this->bounds).max.z - (this->bounds).min.z;
      dStack_148 = SQRT(dVar17 * dVar17 + dVar15 * dVar15 + dVar14 * dVar14) * 0.5;
      dStack_140 = 0.0;
      glLineWidth(0x41000000);
      glBegin(1);
      auStack_d8._0_8_ = dStack_148 * 0.85;
      uVar7 = (ulong)uVar9;
      auStack_d8._8_8_ = 0;
      auStack_e8._8_4_ = (int)auStack_d8._0_8_;
      auStack_e8._0_8_ = auStack_d8._0_8_;
      auStack_e8._12_4_ = (int)((ulong)auStack_d8._0_8_ >> 0x20);
      lVar10 = uVar7 * 0x18;
      for (uVar13 = uVar7; uVar13 < 3; uVar13 = uVar13 + 1) {
        pVVar3 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_118 = *(double *)((long)&pVVar3->z + lVar10) * (double)auStack_d8._0_8_ + dStack_f8;
        pdVar1 = (double *)((long)&pVVar3->x + lVar10);
        dStack_128 = *pdVar1 * (double)auStack_e8._0_8_ + dStack_108;
        dStack_120 = pdVar1[1] * (double)auStack_e8._8_8_ + dStack_100;
        glColor4ubv(*(undefined8 *)
                     ((long)&(((this->axisColors).
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data + lVar10));
        glVertex3dv(&dStack_108);
        glVertex3dv(&dStack_128);
        lVar10 = lVar10 + 0x18;
      }
      glEnd();
      glBegin(4);
      dStack_98 = dStack_148 * 0.5 * 0.15;
      auStack_88._8_8_ = 0;
      auStack_88._0_8_ = dStack_98;
      auStack_a8._8_4_ = SUB84(dStack_148,0);
      auStack_a8._0_8_ = dStack_148;
      uStack_9c = (int)((ulong)dStack_148 >> 0x20);
      dStack_90 = dStack_98;
      while (uVar7 < 3) {
        pVVar3 = (this->axes).
                 super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dStack_118 = pVVar3[uVar7].z * dStack_148 + dStack_f8;
        dStack_128 = pVVar3[uVar7].x * (double)auStack_a8._0_8_ + dStack_108;
        dStack_120 = pVVar3[uVar7].y * stack0xffffffffffffff60 + dStack_100;
        dStack_168 = pVVar3[uVar7].x * (double)auStack_e8._0_8_ + dStack_108;
        dStack_160 = pVVar3[uVar7].y * (double)auStack_e8._8_8_ + dStack_100;
        auStack_158._0_8_ = pVVar3[uVar7].z * (double)auStack_d8._0_8_ + dStack_f8;
        uVar13 = uVar7 + 1;
        uVar8 = uVar13;
        if (uVar13 == 3) {
          uVar8 = 0;
        }
        dStack_178 = pVVar3[uVar8].z * (double)auStack_88._0_8_;
        uVar12 = (ulong)((int)uVar7 - 1);
        if (uVar7 == 0) {
          uVar12 = 2;
        }
        dStack_b8 = pVVar3[uVar8].x * dStack_98;
        dStack_b0 = pVVar3[uVar8].y * dStack_90;
        uStack_c8 = pVVar3[uVar12].x * dStack_98;
        dStack_c0 = pVVar3[uVar12].y * dStack_90;
        dVar15 = pVVar3[uVar12].z * (double)auStack_88._0_8_;
        glColor4ubv((this->axisColors).
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar7].
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
        dStack_188 = 0.0;
        for (iVar11 = 1; uVar7 = uVar13, iVar11 != 9; iVar11 = iVar11 + 1) {
          dVar14 = dStack_188 * 6.283185307179586 * 0.125;
          auStack_138._0_8_ = dVar14;
          dStack_188 = dStack_188 + 1.0;
          dStack_170 = (double)iVar11 * 6.283185307179586 * 0.125;
          dVar14 = cos(dVar14);
          dVar16 = dStack_178 * dVar14 + (double)auStack_158._0_8_;
          dVar17 = dVar14 * dStack_b0 + dStack_160;
          auStack_78._8_4_ = SUB84(dVar17,0);
          auStack_78._0_8_ = dVar14 * dStack_b8 + dStack_168;
          auStack_78._12_4_ = (int)((ulong)dVar17 >> 0x20);
          dVar14 = sin((double)auStack_138._0_8_);
          dStack_48 = (double)auStack_78._0_8_ - dVar14 * uStack_c8;
          dStack_40 = (double)auStack_78._8_8_ - dVar14 * dStack_c0;
          dStack_38 = dVar16 - dVar15 * dVar14;
          dVar14 = cos(dStack_170);
          dVar16 = dStack_178 * dVar14 + (double)auStack_158._0_8_;
          dVar17 = dVar14 * dStack_b0 + dStack_160;
          auStack_138._8_4_ = SUB84(dVar17,0);
          auStack_138._0_8_ = dVar14 * dStack_b8 + dStack_168;
          auStack_138._12_4_ = (int)((ulong)dVar17 >> 0x20);
          dVar14 = sin(dStack_170);
          dStack_68 = (double)auStack_138._0_8_ - dVar14 * uStack_c8;
          dStack_60 = (double)auStack_138._8_8_ - dVar14 * dStack_c0;
          dStack_58 = dVar16 - dVar15 * dVar14;
          glVertex3dv(&dStack_128);
          glVertex3dv(&dStack_48);
          glVertex3dv(&dStack_68);
          glVertex3dv(&dStack_48);
          glVertex3dv(&dStack_168);
          glVertex3dv(&dStack_68);
        }
      }
      glEnd();
      if ((this->transformedMode == false) || (this->objectMode == true)) {
        drawCenterHandle(this);
      }
      glLineWidth(0x3f800000);
    }
    return;
  }
  return;
}

Assistant:

void XFormWidget::drawHandles() const
{
   switch( mode )
   {
      case Mode::Translate:
         drawTranslateHandles();
         break;
      case Mode::Rotate:
         drawRotateHandles();
         break;
      case Mode::Scale:
         drawScaleHandles();
         break;
      default:
         break;
   }
}